

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::RunContext::getCurrentTestName_abi_cxx11_(RunContext *this)

{
  TestCaseInfo *pTVar1;
  long in_RSI;
  string *in_RDI;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    pTVar1 = TestCaseHandle::getTestCaseInfo(*(TestCaseHandle **)(in_RSI + 0x18));
    std::__cxx11::string::string((string *)in_RDI,(string *)pTVar1);
  }
  return in_RDI;
}

Assistant:

std::string RunContext::getCurrentTestName() const {
        return m_activeTestCase
            ? m_activeTestCase->getTestCaseInfo().name
            : std::string();
    }